

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_subquery.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Binder::PlanLateralJoin
          (Binder *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *left,unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *right,vector<duckdb::CorrelatedColumnInfo,_true> *correlated,JoinType join_type,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> condition)

{
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> context;
  undefined4 uVar1;
  bool perform_delim;
  int iVar2;
  pointer pEVar3;
  type op;
  pointer pLVar4;
  reference this_00;
  pointer pLVar5;
  type delim_join;
  pointer pLVar6;
  _Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false> _Var7;
  type expr;
  BinderException *pBVar8;
  undefined7 in_register_00000081;
  vector<duckdb::CorrelatedColumnInfo,_true> *correlated_columns;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *in_stack_00000008;
  _Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false> local_200;
  undefined1 local_1f8 [16];
  _Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false> local_1e8;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_1e0;
  pointer local_1d8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1d0;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_1c8;
  undefined4 local_1bc;
  string local_1b8;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  arbitrary_expressions;
  vector<duckdb::JoinCondition,_true> conditions;
  vector<duckdb::ColumnBinding,_true> plan_columns;
  _Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> local_140;
  FlattenDependentJoins flatten;
  
  correlated_columns =
       (vector<duckdb::CorrelatedColumnInfo,_true> *)CONCAT71(in_register_00000081,join_type);
  conditions.super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  conditions.super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  conditions.super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  arbitrary_expressions.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arbitrary_expressions.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arbitrary_expressions.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1bc = condition.
              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
              _M_t.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl._0_4_;
  if ((in_stack_00000008->
      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(in_stack_00000008);
    iVar2 = (*(pEVar3->super_BaseExpression)._vptr_BaseExpression[4])(pEVar3);
    if ((char)iVar2 != '\0') {
      pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
      expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(in_stack_00000008);
      ::std::__cxx11::string::string
                ((string *)&flatten,"Subqueries are not supported in LATERAL join conditions",
                 (allocator *)&local_1b8);
      BinderException::BinderException<>(pBVar8,expr,(string *)&flatten);
      __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    context._M_head_impl =
         left[2].
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    local_1d0._M_head_impl =
         (in_stack_00000008->
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (in_stack_00000008->
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    LogicalComparisonJoin::ExtractJoinConditions
              ((ClientContext *)context._M_head_impl,
               (JoinType)
               condition.
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl,REGULAR,right,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)correlated,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_1d0,&conditions,&arbitrary_expressions);
    if (local_1d0._M_head_impl != (Expression *)0x0) {
      (*((local_1d0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_1d0._M_head_impl = (Expression *)0x0;
  }
  perform_delim = PerformDuplicateElimination((Binder *)left,correlated_columns);
  local_1c8._M_head_impl =
       (right->
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (right->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
  _M_t.super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  CreateDuplicateEliminatedJoin
            ((duckdb *)&local_200,correlated_columns,
             (JoinType)
             condition.
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)&local_1c8,perform_delim);
  if (local_1c8._M_head_impl != (LogicalOperator *)0x0) {
    (*(local_1c8._M_head_impl)->_vptr_LogicalOperator[1])();
  }
  local_1c8._M_head_impl = (LogicalOperator *)0x0;
  FlattenDependentJoins::FlattenDependentJoins
            (&flatten,(Binder *)left,correlated_columns,perform_delim,false);
  op = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
       operator*((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)correlated);
  uVar1 = local_1bc;
  FlattenDependentJoins::DetectCorrelatedExpressions(&flatten,op,true,0);
  local_1d8 = (correlated->
              super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
              ).
              super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
  (correlated->
  super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>).
  super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  FlattenDependentJoins::PushDownDependentJoin
            ((FlattenDependentJoins *)local_1f8,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)&flatten,SUB81(&local_1d8,0));
  if (local_1d8 != (pointer)0x0) {
    (**(code **)((local_1d8->binding).table_index + 8))();
  }
  local_1d8 = (pointer)0x0;
  pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                       *)local_1f8);
  (*pLVar4->_vptr_LogicalOperator[2])(&plan_columns,pLVar4);
  pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                       *)local_1f8);
  if (pLVar4->type == LOGICAL_MATERIALIZED_CTE) {
    pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)local_1f8);
    this_00 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              ::get<true>(&pLVar4->children,1);
    pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(this_00);
    (*pLVar4->_vptr_LogicalOperator[2])(&local_1b8,pLVar4);
    ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::_M_move_assign
              (&plan_columns.
                super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>,
               &local_1b8);
    ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
    ~_Vector_base((_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)
                  &local_1b8);
  }
  pLVar5 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
           ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                         *)&local_200);
  ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::_M_move_assign
            (&(pLVar5->conditions).
              super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>,
             &conditions);
  delim_join = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
               ::operator*((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                            *)&local_200);
  ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::vector
            ((vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)&local_140,
             &plan_columns.
              super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>);
  CreateDelimJoinConditions
            (delim_join,correlated_columns,(vector<duckdb::ColumnBinding,_true> *)&local_140,
             flatten.delim_offset,perform_delim);
  ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::~_Vector_base
            (&local_140);
  pLVar5 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
           ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                         *)&local_200);
  local_1e0._M_head_impl = (LogicalOperator *)local_1f8._0_8_;
  local_1f8._0_8_ = (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
  LogicalOperator::AddChild
            ((LogicalOperator *)pLVar5,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)&local_1e0);
  if ((Binder *)local_1e0._M_head_impl != (Binder *)0x0) {
    (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)
                 &(local_1e0._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
  }
  _Var7._M_head_impl = local_200._M_head_impl;
  local_1e0._M_head_impl = (LogicalOperator *)0x0;
  if (arbitrary_expressions.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      arbitrary_expressions.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_200._M_head_impl = (LogicalComparisonJoin *)0x0;
  }
  else {
    if ((char)uVar1 != '\x03') {
      pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_1b8,
                 "Join condition for non-inner LATERAL JOIN must be a comparison between the left and right side"
                 ,(allocator *)(local_1f8 + 0xf));
      BinderException::BinderException(pBVar8,&local_1b8);
      __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    make_uniq<duckdb::LogicalFilter>();
    pLVar6 = unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>::
             operator->((unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                         *)&local_1b8);
    std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::_M_move_assign((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      *)&(pLVar6->super_LogicalOperator).expressions,&arbitrary_expressions);
    pLVar6 = unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>::
             operator->((unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                         *)&local_1b8);
    local_1e8._M_head_impl = local_200._M_head_impl;
    local_200._M_head_impl = (LogicalComparisonJoin *)0x0;
    LogicalOperator::AddChild
              (&pLVar6->super_LogicalOperator,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_1e8);
    if ((element_type *)local_1e8._M_head_impl != (element_type *)0x0) {
      (**(code **)((long)(((original *)
                          &((local_1e8._M_head_impl)->super_LogicalJoin).super_LogicalOperator.
                           _vptr_LogicalOperator)->
                         super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 8))
                ();
    }
    local_1e8._M_head_impl = (LogicalComparisonJoin *)0x0;
    _Var7._M_head_impl = (LogicalComparisonJoin *)local_1b8._M_dataplus._M_p;
  }
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var7._M_head_impl;
  ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::~_Vector_base
            ((_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)
             &plan_columns);
  if ((Binder *)local_1f8._0_8_ != (Binder *)0x0) {
    (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_1f8._0_8_)->__weak_this_).
                internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
  }
  FlattenDependentJoins::~FlattenDependentJoins(&flatten);
  if (local_200._M_head_impl != (LogicalComparisonJoin *)0x0) {
    (*((local_200._M_head_impl)->super_LogicalJoin).super_LogicalOperator._vptr_LogicalOperator[1])
              ();
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&arbitrary_expressions);
  ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::~vector
            (&conditions.super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
            );
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> Binder::PlanLateralJoin(unique_ptr<LogicalOperator> left, unique_ptr<LogicalOperator> right,
                                                    vector<CorrelatedColumnInfo> &correlated, JoinType join_type,
                                                    unique_ptr<Expression> condition) {
	// scan the right operator for correlated columns
	// correlated LATERAL JOIN
	vector<JoinCondition> conditions;
	vector<unique_ptr<Expression>> arbitrary_expressions;
	if (condition) {
		if (condition->HasSubquery()) {
			throw BinderException(*condition, "Subqueries are not supported in LATERAL join conditions");
		}
		// extract join conditions, if there are any
		LogicalComparisonJoin::ExtractJoinConditions(context, join_type, JoinRefType::REGULAR, left, right,
		                                             std::move(condition), conditions, arbitrary_expressions);
	}

	auto perform_delim = PerformDuplicateElimination(*this, correlated);
	auto delim_join = CreateDuplicateEliminatedJoin(correlated, join_type, std::move(left), perform_delim);

	FlattenDependentJoins flatten(*this, correlated, perform_delim);

	// first we check which logical operators have correlated expressions in the first place
	flatten.DetectCorrelatedExpressions(*right, true);
	// now we push the dependent join down
	auto dependent_join = flatten.PushDownDependentJoin(std::move(right), join_type != JoinType::INNER);

	// now the dependent join is fully eliminated
	// we only need to create the join conditions between the LHS and the RHS
	// fetch the set of columns
	auto plan_columns = dependent_join->GetColumnBindings();

	// in case of a materialized CTE, the output is defined by the second children operator
	if (dependent_join->type == LogicalOperatorType::LOGICAL_MATERIALIZED_CTE) {
		plan_columns = dependent_join->children[1]->GetColumnBindings();
	}

	// now create the join conditions
	// start off with the conditions that were passed in (if any)
	D_ASSERT(delim_join->conditions.empty());
	delim_join->conditions = std::move(conditions);
	// then add the delim join conditions
	CreateDelimJoinConditions(*delim_join, correlated, plan_columns, flatten.delim_offset, perform_delim);
	delim_join->AddChild(std::move(dependent_join));

	// check if there are any arbitrary expressions left
	if (!arbitrary_expressions.empty()) {
		// we can only evaluate scalar arbitrary expressions for inner joins
		if (join_type != JoinType::INNER) {
			throw BinderException(
			    "Join condition for non-inner LATERAL JOIN must be a comparison between the left and right side");
		}
		auto filter = make_uniq<LogicalFilter>();
		filter->expressions = std::move(arbitrary_expressions);
		filter->AddChild(std::move(delim_join));
		return std::move(filter);
	}
	return std::move(delim_join);
}